

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_HMAC_DRBG.c
# Opt level: O3

uint32_t Hacl_HMAC_DRBG_min_length(Spec_Hash_Definitions_hash_alg a)

{
  undefined8 extraout_RAX;
  
  if ((byte)(a - 1) < 4) {
    return *(uint32_t *)(&DAT_001d20a0 + (ulong)(byte)(a - 1) * 4);
  }
  Hacl_HMAC_DRBG_min_length_cold_1();
  return (uint32_t)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
}

Assistant:

uint32_t Hacl_HMAC_DRBG_min_length(Spec_Hash_Definitions_hash_alg a)
{
  switch (a)
  {
    case Spec_Hash_Definitions_SHA1:
      {
        return 16U;
      }
    case Spec_Hash_Definitions_SHA2_256:
      {
        return 32U;
      }
    case Spec_Hash_Definitions_SHA2_384:
      {
        return 32U;
      }
    case Spec_Hash_Definitions_SHA2_512:
      {
        return 32U;
      }
    default:
      {
        KRML_HOST_EPRINTF("KaRaMeL incomplete match at %s:%d\n", __FILE__, __LINE__);
        KRML_HOST_EXIT(253U);
      }
  }
}